

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O2

void __thiscall
tcu::Vector<tcu::Interval,_4>::Vector(Vector<tcu::Interval,_4> *this,Vector<tcu::Interval,_4> *v)

{
  bool *pbVar1;
  bool *pbVar2;
  double dVar3;
  long lVar4;
  
  lVar4 = 8;
  do {
    *(undefined1 *)((long)this->m_data + lVar4 + -8) = 0;
    pbVar1 = &this->m_data[0].m_hasNaN + lVar4;
    *(undefined8 *)pbVar1 = 0x7ff0000000000000;
    *(double *)(pbVar1 + 8) = -INFINITY;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x68);
  for (lVar4 = 0; lVar4 != 0x60; lVar4 = lVar4 + 0x18) {
    *(undefined8 *)((long)&this->m_data[0].m_hi + lVar4) =
         *(undefined8 *)((long)&v->m_data[0].m_hi + lVar4);
    pbVar1 = &v->m_data[0].m_hasNaN + lVar4;
    dVar3 = *(double *)(pbVar1 + 8);
    pbVar2 = &this->m_data[0].m_hasNaN + lVar4;
    *(undefined8 *)pbVar2 = *(undefined8 *)pbVar1;
    *(double *)(pbVar2 + 8) = dVar3;
  }
  return;
}

Assistant:

inline Vector<T, Size>::Vector (const Vector<T, Size>& v)
{
	for (int i = 0; i < Size; i++)
		m_data[i] = v.m_data[i];
}